

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaching-definitions-transfer-function.h
# Opt level: O0

void __thiscall
wasm::analysis::ReachingDefinitionsTransferFunction::evaluateFunctionEntry
          (ReachingDefinitionsTransferFunction *this,Function *func,Element *inputState)

{
  bool bVar1;
  reference ppLVar2;
  LocalSet *currSet;
  iterator __end2;
  iterator __begin2;
  unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
  *__range2;
  Element *inputState_local;
  Function *func_local;
  ReachingDefinitionsTransferFunction *this_local;
  
  __end2 = std::
           unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
           ::begin(&this->fakeSetPtrs);
  currSet = (LocalSet *)
            std::
            unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
            ::end(&this->fakeSetPtrs);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<wasm::LocalSet_*,_false>,
                       (_Node_iterator_base<wasm::LocalSet_*,_false> *)&currSet);
    if (!bVar1) break;
    ppLVar2 = std::__detail::_Node_iterator<wasm::LocalSet_*,_true,_false>::operator*(&__end2);
    FinitePowersetLattice<wasm::LocalSet_*>::add(&this->lattice,inputState,*ppLVar2);
    std::__detail::_Node_iterator<wasm::LocalSet_*,_true,_false>::operator++(&__end2);
  }
  return;
}

Assistant:

void
  evaluateFunctionEntry(Function* func,
                        FinitePowersetLattice<LocalSet*>::Element& inputState) {
    for (auto currSet : fakeSetPtrs) {
      lattice.add(&inputState, currSet);
    }
  }